

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtsStreamReader.cpp
# Opt level: O1

void __thiscall
DTSStreamReader::writePESExtension(DTSStreamReader *this,PESPacket *pesPacket,AVPacket *avPacket)

{
  byte bVar1;
  uint8_t uVar2;
  
  if (this->m_useNewStyleAudioPES == true) {
    pesPacket->flagsLo = pesPacket->flagsLo | 1;
    bVar1 = pesPacket->m_pesHeaderLen + 9;
    *(undefined2 *)(&pesPacket->startCode0 + bVar1) = 0x8101;
    uVar2 = 'r';
    if (this->m_state != stDecodeHD2) {
      uVar2 = 'r' - (this->m_isCoreExists & 1U);
    }
    (&pesPacket->startCode2)[bVar1] = uVar2;
    pesPacket->m_pesHeaderLen = pesPacket->m_pesHeaderLen + '\x03';
  }
  return;
}

Assistant:

void DTSStreamReader::writePESExtension(PESPacket* pesPacket, const AVPacket& avPacket)
{
    // 0f 81 71 - from blu ray DTS-HD  ( can use 0x01 instead 0x0f. bits 1-3 are reserved.)
    // 0x01 0x81 0x71 - ordinal DTS == 0x71?
    if (m_useNewStyleAudioPES)
    {
        pesPacket->flagsLo |= 1;  // enable PES extension for DTS stream
        uint8_t* data = reinterpret_cast<uint8_t*>(pesPacket) + pesPacket->getHeaderLength();
        *data++ = 1;     // PES_extension_flag_2
        *data++ = 0x81;  // marker bit + extension2 len
        if (m_state == DTSDecodeState::stDecodeHD2 || !m_isCoreExists)
            *data = 0x72;  // stream id extension. 71 = DTS frame, 72 HD frame
        else
            *data = 0x71;  // stream id extension
        pesPacket->m_pesHeaderLen += 3;
    }
}